

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

String * __thiscall
cplus::lang::ByteArray::toHexString(String *__return_storage_ptr__,ByteArray *this)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  char *str;
  char *pcVar4;
  size_t sVar5;
  
  sVar2 = this->size;
  str = (char *)operator_new__(sVar2 * 3 + 1);
  str[sVar2 * 3] = '\0';
  pcVar3 = this->buffer;
  pcVar4 = str + 2;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    bVar1 = pcVar3[sVar5];
    pcVar4[-1] = "0123456789abcdef"[bVar1 & 0xf];
    pcVar4[-2] = "0123456789abcdef"[bVar1 >> 4];
    *pcVar4 = ' ';
    pcVar4 = pcVar4 + 3;
  }
  String::String(__return_storage_ptr__,str);
  operator_delete__(str);
  return __return_storage_ptr__;
}

Assistant:

lang::String ByteArray::toHexString() const {
			auto *buffer = new char[size * 3 + 1];
			buffer[size * 3] = 0;
			for (int index = 0; index < size; index++) {
				binToHex(this->buffer[index], buffer + index * 3);
				buffer[index * 3 + 2] = ' ';
			}
			auto ret = lang::String(buffer);
			delete[] buffer;
			return ret;
		}